

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::TraverseSchema::checkTypeFromAnotherSchema
          (TraverseSchema *this,DOMElement *elem,XMLCh *typeStr)

{
  bool bVar1;
  XMLCh *prefix_00;
  XMLCh *typeURI;
  XMLCh *prefix;
  XMLCh *typeStr_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  prefix_00 = getPrefix(this,typeStr);
  this_local = (TraverseSchema *)resolvePrefixToURI(this,elem,prefix_00);
  bVar1 = XMLString::equals((XMLCh *)this_local,this->fTargetNSURIString);
  if ((bVar1) ||
     (bVar1 = XMLString::equals((XMLCh *)this_local,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA),
     bVar1)) {
    this_local = (TraverseSchema *)0x0;
  }
  return (XMLCh *)this_local;
}

Assistant:

const XMLCh*
TraverseSchema::checkTypeFromAnotherSchema(const DOMElement* const elem,
                                           const XMLCh* const typeStr) {

    const XMLCh* prefix = getPrefix(typeStr);
    const XMLCh* typeURI = resolvePrefixToURI(elem, prefix);

    if (!XMLString::equals(typeURI, fTargetNSURIString)
        && !XMLString::equals(typeURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)
        ) {
        return typeURI;
    }

    return 0;
}